

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_ReleaseFromArenaMessageMakesCopy_Test::
~ArenaTest_ReleaseFromArenaMessageMakesCopy_Test
          (ArenaTest_ReleaseFromArenaMessageMakesCopy_Test *this)

{
  ArenaTest_ReleaseFromArenaMessageMakesCopy_Test *this_local;
  
  ~ArenaTest_ReleaseFromArenaMessageMakesCopy_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, ReleaseFromArenaMessageMakesCopy) {
  TestAllTypes::NestedMessage* nested_msg = nullptr;
  std::string* nested_string = nullptr;
  {
    Arena arena;
    TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
    arena_message->mutable_optional_nested_message()->set_bb(42);
    *arena_message->mutable_optional_string() = "Hello";
    nested_msg = arena_message->release_optional_nested_message();
    nested_string = arena_message->release_optional_string();
  }
  EXPECT_EQ(42, nested_msg->bb());
  EXPECT_EQ("Hello", *nested_string);
  delete nested_msg;
  delete nested_string;
}